

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

void PVG_FT_Stroker_ExportBorder
               (PVG_FT_Stroker stroker,PVG_FT_StrokerBorder border,PVG_FT_Outline *outline)

{
  PVG_FT_StrokeBorder sborder;
  PVG_FT_Outline *outline_local;
  PVG_FT_StrokerBorder border_local;
  PVG_FT_Stroker stroker_local;
  
  if (((border == PVG_FT_STROKER_BORDER_LEFT) || (border == PVG_FT_STROKER_BORDER_RIGHT)) &&
     (stroker->borders[border].valid != '\0')) {
    ft_stroke_border_export(stroker->borders + border,outline);
  }
  return;
}

Assistant:

void PVG_FT_Stroker_ExportBorder(PVG_FT_Stroker       stroker,
                                PVG_FT_StrokerBorder border,
                                PVG_FT_Outline*      outline)
{
    if (border == PVG_FT_STROKER_BORDER_LEFT ||
        border == PVG_FT_STROKER_BORDER_RIGHT) {
        PVG_FT_StrokeBorder sborder = &stroker->borders[border];

        if (sborder->valid) ft_stroke_border_export(sborder, outline);
    }
}